

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O0

void death_knowledge(player *p)

{
  time_t local_28;
  time_t death_time;
  object *obj;
  store *home;
  player *p_local;
  
  obj = (object *)(stores + (int)(f_info[0xe].shopnum - 1));
  local_28 = 0;
  home = (store *)p;
  if (p->total_winner != 0) {
    p->depth = 0;
    my_strcpy(p->died_from,"Ripe Old Age",0x50);
    *(undefined4 *)((long)&home->always_table + 4) = *(undefined4 *)&home->always_table;
    *(undefined2 *)((long)&home->always_num + 4) = *(undefined2 *)((long)&home->always_num + 2);
    *(int *)&home->always_size = (int)home->always_size + 10000000;
  }
  player_learn_all_runes((player *)home);
  for (death_time = (time_t)home[4].normal_table; death_time != 0;
      death_time = *(time_t *)(death_time + 0x20)) {
    object_flavor_aware((player *)home,(object *)death_time);
    *(undefined8 *)(*(long *)(death_time + 0x28) + 0xf0) = *(undefined8 *)(death_time + 0xf0);
    *(undefined8 *)(*(long *)(death_time + 0x28) + 0x100) = *(undefined8 *)(death_time + 0x100);
  }
  for (death_time = (time_t)obj->prev; death_time != 0; death_time = *(time_t *)(death_time + 0x20))
  {
    object_flavor_aware((player *)home,(object *)death_time);
    *(undefined8 *)(*(long *)(death_time + 0x28) + 0xf0) = *(undefined8 *)(death_time + 0xf0);
    *(undefined8 *)(*(long *)(death_time + 0x28) + 0x100) = *(undefined8 *)(death_time + 0x100);
  }
  history_unmask_unknown((player *)home);
  time(&local_28);
  enter_score((player *)home,&local_28);
  *(uint *)(*(long *)&home[10].feat + 0x34) = *(uint *)(*(long *)&home[10].feat + 0x34) | 1;
  handle_stuff((player *)home);
  return;
}

Assistant:

void death_knowledge(struct player *p)
{
	struct store *home = &stores[f_info[FEAT_HOME].shopnum - 1];
	struct object *obj;
	time_t death_time = (time_t)0;

	/* Retire in the town in a good state */
	if (p->total_winner) {
		p->depth = 0;
		my_strcpy(p->died_from, "Ripe Old Age", sizeof(p->died_from));
		p->exp = p->max_exp;
		p->lev = p->max_lev;
		p->au += 10000000L;
	}

	player_learn_all_runes(p);
	for (obj = p->gear; obj; obj = obj->next) {
		object_flavor_aware(p, obj);
		obj->known->effect = obj->effect;
		obj->known->activation = obj->activation;
	}

	for (obj = home->stock; obj; obj = obj->next) {
		object_flavor_aware(p, obj);
		obj->known->effect = obj->effect;
		obj->known->activation = obj->activation;
	}

	history_unmask_unknown(p);

	/* Get time of death */
	(void)time(&death_time);
	enter_score(p, &death_time);

	/* Hack -- Recalculate bonuses */
	p->upkeep->update |= (PU_BONUS);
	handle_stuff(p);
}